

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O2

bool __thiscall
dg::array_match(dg *this,StringRef name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names)

{
  StringRef *pSVar1;
  StringRef *pSVar2;
  bool bVar3;
  StringRef *pSVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *nm;
  StringRef LHS;
  
  LHS.Length = name.Data;
  pSVar1 = (StringRef *)((undefined8 *)name.Length)[1];
  pSVar2 = *(StringRef **)name.Length;
  do {
    pSVar4 = pSVar2;
    if (pSVar4 == pSVar1) break;
    LHS.Data = (char *)this;
    bVar3 = llvm::operator==(LHS,*pSVar4);
    pSVar2 = pSVar4 + 2;
  } while (!bVar3);
  return pSVar4 != pSVar1;
}

Assistant:

static bool array_match(llvm::StringRef name,
                        const std::vector<std::string> &names) {
    for (const auto &nm : names) {
        if (name == nm)
            return true;
    }

    return false;
}